

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O1

void __thiscall Exttpose::do_invert_db(Exttpose *this,int pblk,int mincustid,int maxcustid)

{
  TransArray *this_00;
  pointer pTVar1;
  pointer piVar2;
  int fd;
  ExttposeArgument *pEVar3;
  unsigned_long uVar4;
  ostream *this_01;
  long *plVar5;
  runtime_error *this_02;
  int use_seq;
  undefined4 in_register_0000000c;
  int *piVar6;
  long lVar7;
  undefined4 in_register_00000034;
  uint custid_00;
  DbaseCtrlBlk *this_03;
  ostringstream *poVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int custid;
  int tid;
  int numitem;
  int *buf;
  string tmpnam;
  ostringstream tmpname;
  int local_230;
  uint local_22c;
  int local_228;
  int local_224;
  uint local_220;
  int local_21c;
  int *local_218;
  uint local_20c;
  int local_208;
  int local_204;
  undefined8 local_200;
  undefined8 local_1f8;
  DbaseCtrlBlk *local_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  char *local_1c8;
  char local_1b8 [16];
  ostringstream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_1f8 = CONCAT44(in_register_00000034,pblk);
  local_200 = CONCAT44(in_register_0000000c,maxcustid);
  local_224 = 0;
  local_228 = 0;
  local_22c = 0;
  local_218 = (int *)0x0;
  local_204 = mincustid;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  this_03 = &this->dcb;
  DbaseCtrlBlk::get_first_blk(this_03);
  DbaseCtrlBlk::get_next_trans(this_03,&local_218,&local_224,&local_228,(int *)&local_22c);
  pEVar3 = this->args;
  if (0 < pEVar3->num_partitions) {
    local_208 = (int)local_200 + 1;
    local_230 = 0;
    local_1f0 = this_03;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pEVar3->output)._M_dataplus._M_p,
                 (pEVar3->output)._M_string_length);
      if (1 < this->args->num_partitions) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".P",2);
        std::ostream::operator<<((ostream *)local_1a8,local_230);
      }
      std::__cxx11::stringbuf::str();
      local_1e0 = 0;
      local_1d8[0] = 0;
      local_1e8 = local_1d8;
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      fd = open(local_1c8,0x241,0x1b6);
      if (fd < 0) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"Can\'t open out file");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = this->numfreq;
      if (uVar4 != 0) {
        piVar6 = &((this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                   _M_impl.super__Vector_impl_data._M_start)->theSize;
        do {
          *(undefined8 *)(piVar6 + -1) = 0;
          *(char *)(piVar6 + -2) = '\0';
          piVar6 = piVar6 + 0x12;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      iVar10 = local_230 * (int)local_1f8 + local_204;
      local_21c = (int)local_1f8 + iVar10;
      if ((int)local_200 <= local_21c) {
        local_21c = local_208;
      }
      poVar8 = &this->env->logger;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,"BOUNDS ",7);
      this_01 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(this_01," ",1);
      plVar5 = (long *)std::ostream::operator<<((ostream *)this_01,local_21c);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      while (((this->dcb).readall != '\x01' && (local_20c = local_22c, (int)local_22c < local_21c)))
      {
        local_220 = 0;
        while ((((this->dcb).readall != '\x01' && (local_20c == local_22c)) &&
               ((int)local_22c < local_21c))) {
          if (this->args->use_diff == '\0') {
            if (0 < local_224) {
              lVar11 = 0;
              do {
                iVar10 = (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_218[lVar11]];
                lVar7 = (long)iVar10;
                if (lVar7 != -1) {
                  pEVar3 = this->args;
                  if (pEVar3->use_newformat == '\0') {
                    use_seq = pEVar3->use_seq;
                    if ((use_seq != 0) &&
                       (pTVar1 = (this->extary).
                                 super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl
                                 .super__Vector_impl_data._M_start, pTVar1[lVar7].theFlg == '\0')) {
                      this_00 = pTVar1 + lVar7;
                      (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)local_220] = iVar10;
                      this_00->theFlg = '\x01';
                      TransArray::add(this_00,fd,local_228,pEVar3->use_seq,local_230,local_22c);
                      local_220 = local_220 + 1;
                      goto LAB_001094b9;
                    }
                    pTVar1 = (this->extary).
                             super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    custid_00 = 0xffffffff;
                  }
                  else {
                    pTVar1 = (this->extary).
                             super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    use_seq = pEVar3->use_seq;
                    custid_00 = local_22c;
                  }
                  TransArray::add(pTVar1 + lVar7,fd,local_228,use_seq,local_230,custid_00);
                }
LAB_001094b9:
                lVar11 = lVar11 + 1;
              } while (lVar11 < local_224);
            }
          }
          else {
            uVar9 = 0;
            if (0 < local_224) {
              iVar10 = 0;
              do {
                if ((this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_218[uVar9]] != -1) {
                  lVar11 = (long)iVar10;
                  if ((this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11] < local_218[uVar9]) {
                    lVar7 = lVar11 * 0x48;
                    do {
                      lVar11 = lVar11 + 1;
                      TransArray::add((TransArray *)
                                      ((long)&(((this->extary).
                                                super__Vector_base<TransArray,_std::allocator<TransArray>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->theArray
                                              ).super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl + lVar7),fd,local_228,this->args->use_seq,
                                      local_230,
                                      -(uint)(this->args->use_newformat == '\0') | local_22c);
                      lVar7 = lVar7 + 0x48;
                      iVar10 = iVar10 + 1;
                    } while ((this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar11] < local_218[uVar9]);
                  }
                  iVar10 = iVar10 + 1;
                }
                uVar9 = uVar9 + 1;
              } while ((long)uVar9 < (long)local_224);
              uVar9 = (ulong)iVar10;
              this_03 = local_1f0;
            }
            if (uVar9 < this->numfreq) {
              lVar11 = uVar9 * 0x48;
              do {
                TransArray::add((TransArray *)
                                ((long)&(((this->extary).
                                          super__Vector_base<TransArray,_std::allocator<TransArray>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->theArray).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                lVar11),fd,local_228,this->args->use_seq,local_230,
                                -(uint)(this->args->use_newformat == '\0') | local_22c);
                uVar9 = uVar9 + 1;
                lVar11 = lVar11 + 0x48;
              } while (uVar9 < this->numfreq);
            }
          }
          DbaseCtrlBlk::get_next_trans(this_03,&local_218,&local_224,&local_228,(int *)&local_22c);
        }
        if (((this->args->use_newformat == '\0') && (this->args->use_seq != 0)) &&
           (0 < (int)local_220)) {
          pTVar1 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          piVar2 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = 0;
          do {
            iVar10 = piVar2[uVar9];
            *(int *)(*(long *)&pTVar1[iVar10].theArray.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl + 4 + (long)pTVar1[iVar10].lastPos * 4) =
                 (pTVar1[iVar10].theSize - pTVar1[iVar10].lastPos) + -2;
            pTVar1[iVar10].lastPos = pTVar1[iVar10].theSize;
            pTVar1[piVar2[uVar9]].theFlg = '\0';
            uVar9 = uVar9 + 1;
          } while (local_220 != uVar9);
        }
      }
      if (this->numfreq != 0) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          TransArray::flushbuf
                    ((TransArray *)
                     ((long)&(((this->extary).
                               super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                               super__Vector_impl_data._M_start)->theArray).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar11),fd,
                     this->args->use_seq,local_230);
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x48;
        } while (uVar9 < this->numfreq);
      }
      close(fd);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      local_230 = local_230 + 1;
      pEVar3 = this->args;
    } while (local_230 < pEVar3->num_partitions);
  }
  poVar8 = &this->env->logger;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,"WROTE INVERT ",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Exttpose::do_invert_db(int pblk, int mincustid, int maxcustid) {
    int numitem = 0, tid = 0, custid = 0; // DD: to avoid gcc warning uninitialized var
    int *buf = nullptr; // DD: to avoid gcc warning uninitialized var
    ostringstream tmpname;
    int fd;
    int i, j, k, idx;

    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int ocid;// = -1;
    for (int p = 0; p < args.num_partitions; p++) {
        tmpname << args.output;

        if (args.num_partitions > 1) {
            tmpname << ".P" << p;
        }
        
        string tmpnam = tmpname.str();
        tmpname.str(string());

        if ((fd = open(tmpnam.c_str(), (O_WRONLY | O_CREAT | O_TRUNC | O_BINARY), 0666)) < 0) {
            throw runtime_error("Can't open out file");
        }

        for (i = 0; i < numfreq; i++) {
            extary[i].reset();
        }
        //count 2-itemsets
        int plb = p * pblk + mincustid;
        int pub = plb + pblk;
        if (pub >= maxcustid) pub = maxcustid + 1;
        env.logger << "BOUNDS " << plb << " " << pub << endl;
        int fcnt;
        for (; !dcb.eof() && custid < pub;) {
            fcnt = 0;
            ocid = custid;
            //env.logger << "TID " << custid << " " << tid << " " << numitem << endl;
            while (!dcb.eof() && ocid == custid && custid < pub) {
                //for (k=0; k < numitem; k++){

                // }

                if (args.use_diff) {
                    //add this tid to all items not in the trans
                    k = 0;
                    for (j = 0; j < numitem; j++) {
                        if (freqidx[buf[j]] == -1) continue;

                        while (backidx[k] < buf[j]) {
                            //if ((idx = freqidx[backidx[k]]) != -1){
                            idx = k;
                            if (!args.use_newformat)
                                extary[idx].add(fd, tid, args.use_seq, p);
                            else extary[idx].add(fd, tid, args.use_seq, p, custid);
                            //}
                            k++;
                        }
                        k++; //skip over buf[j]
                    }
                    for (; k < numfreq; k++) {
                        //if ((idx = freqidx[backidx[k]]) != -1){
                        idx = k;
                        if (!args.use_newformat)
                            extary[idx].add(fd, tid, args.use_seq, p);
                        else extary[idx].add(fd, tid, args.use_seq, p, custid);
                        //}
                    }
                } else {
                    // add this tid to all items in the trans
                    for (j = 0; j < numitem; j++) {
                        idx = freqidx[buf[j]];
                        if (idx != -1) {
                            if (!args.use_newformat) {
                                if (args.use_seq && extary[idx].flg() == 0) {
                                    fidx[fcnt] = idx;
                                    fcnt++;
                                    extary[idx].setflg(1);
                                    extary[idx].add(fd, tid, args.use_seq, p, custid);
                                } else {
                                    extary[idx].add(fd, tid, args.use_seq, p);
                                }
                            } else {
                                extary[idx].add(fd, tid, args.use_seq, p, custid);
                            }
                        }
                    }
                }

                dcb.get_next_trans(buf, numitem, tid, custid);
            }
            if (!args.use_newformat && args.use_seq) {
                for (k = 0; k < fcnt; k++) {
                    extary[fidx[k]].setlastpos();
                    extary[fidx[k]].setflg(0);
                }
                fcnt = 0;
            }
        }

        for (i = 0; i < numfreq; i++) {
            //env.logger << "FLUSH " << i << " " << extary[i].lastPos << " " <<
            //   extary[i].theSize << endl;
            extary[i].flushbuf(fd, args.use_seq, p);
        }
        close(fd);
    }
    env.logger << "WROTE INVERT " << endl;
}